

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

bool __thiscall leveldb::Compaction::IsBaseLevelForKey(Compaction *this,Slice *user_key)

{
  long lVar1;
  Comparator *pCVar2;
  Version *pVVar3;
  pointer ppFVar4;
  FileMetaData *pFVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  long in_FS_OFFSET;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = (long)this->level_;
  bVar6 = 4 < lVar8;
  if (lVar8 < 5) {
    pCVar2 = (this->input_version_->vset_->icmp_).user_comparator_;
    lVar8 = lVar8 + 2;
    do {
      pVVar3 = this->input_version_;
      do {
        ppFVar4 = pVVar3->files_[lVar8].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)pVVar3->files_[lVar8].
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3) <=
            this->level_ptrs_[lVar8]) goto LAB_0067d8c5;
        pFVar5 = ppFVar4[this->level_ptrs_[lVar8]];
        local_48 = InternalKey::user_key(&pFVar5->largest);
        iVar7 = (*pCVar2->_vptr_Comparator[2])(pCVar2,user_key,&local_48);
        if (iVar7 < 1) {
          local_48 = InternalKey::user_key(&pFVar5->smallest);
          iVar7 = (*pCVar2->_vptr_Comparator[2])(pCVar2,user_key,&local_48);
          iVar7 = (iVar7 >> 0x1f) * -5 + 1;
        }
        else {
          this->level_ptrs_[lVar8] = this->level_ptrs_[lVar8] + 1;
          iVar7 = 0;
        }
      } while (iVar7 == 0);
      if (iVar7 != 6) break;
LAB_0067d8c5:
      lVar1 = lVar8 + 1;
      bVar6 = 5 < lVar8;
      lVar8 = lVar1;
    } while ((int)lVar1 != 7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool Compaction::IsBaseLevelForKey(const Slice& user_key) {
  // Maybe use binary search to find right entry instead of linear search?
  const Comparator* user_cmp = input_version_->vset_->icmp_.user_comparator();
  for (int lvl = level_ + 2; lvl < config::kNumLevels; lvl++) {
    const std::vector<FileMetaData*>& files = input_version_->files_[lvl];
    while (level_ptrs_[lvl] < files.size()) {
      FileMetaData* f = files[level_ptrs_[lvl]];
      if (user_cmp->Compare(user_key, f->largest.user_key()) <= 0) {
        // We've advanced far enough
        if (user_cmp->Compare(user_key, f->smallest.user_key()) >= 0) {
          // Key falls in this file's range, so definitely not base level
          return false;
        }
        break;
      }
      level_ptrs_[lvl]++;
    }
  }
  return true;
}